

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void __thiscall
embree::sse2::
BVHNIntersector1<4,_16777232,_true,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
::intersect(BVHNIntersector1<4,_16777232,_true,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
            *this,Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  Collider CVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  int iVar27;
  AABBNodeMB4D *node1;
  ulong uVar28;
  undefined1 (*pauVar29) [16];
  undefined4 uVar30;
  byte *pbVar31;
  ulong uVar32;
  RayQueryContext *pRVar33;
  ulong uVar34;
  undefined1 (*pauVar35) [16];
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  float fVar52;
  float fVar60;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  float fVar75;
  float fVar76;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar77;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar85;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar96;
  float fVar99;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar97;
  float fVar98;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar95 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar107;
  float fVar113;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar114;
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar115 [16];
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined4 uVar124;
  float fVar125;
  undefined4 uVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar135 [16];
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1241;
  ulong local_1240;
  long local_1238;
  float fStack_1230;
  float fStack_122c;
  int local_121c;
  undefined8 local_1218;
  float fStack_1210;
  float fStack_120c;
  undefined8 local_1208;
  float fStack_1200;
  float fStack_11fc;
  undefined8 local_11f8;
  float fStack_11f0;
  float fStack_11ec;
  undefined1 local_11e8 [16];
  Intersectors *local_11d8;
  RayHit *local_11d0;
  RayQueryContext *local_11c8;
  undefined1 (*local_11c0) [16];
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  undefined1 local_11a8 [8];
  float fStack_11a0;
  float fStack_119c;
  undefined8 local_1198;
  float fStack_1190;
  float fStack_118c;
  undefined8 local_1188;
  float fStack_1180;
  float fStack_117c;
  int *local_1178;
  byte *local_1170;
  undefined4 *local_1168;
  Intersectors *local_1160;
  float *local_1158;
  undefined4 local_1150;
  float local_1148;
  float local_1144;
  undefined4 local_1140;
  undefined4 local_113c;
  undefined4 local_1138;
  undefined4 local_1134;
  uint local_1130;
  undefined4 local_112c;
  undefined4 local_1128;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  undefined1 local_1108 [12];
  float fStack_10fc;
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 *local_10d8;
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  float local_1078 [4];
  undefined1 local_1068 [16];
  uint local_1058;
  uint uStack_1054;
  uint uStack_1050;
  uint uStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [8];
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [8];
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)(*(long *)this + 0x70) != 8) {
    pauVar35 = (undefined1 (*) [16])local_f68;
    local_f78 = *(long *)(*(long *)this + 0x70);
    uStack_f70 = 0;
    fVar85 = *(float *)&This->ptr;
    fVar157 = *(float *)((long)&This->ptr + 4);
    fVar147 = *(float *)&This->leafIntersector;
    fVar140 = *(float *)((long)&This->leafIntersector + 4);
    CVar19 = This->collider;
    fVar52 = 0.0;
    if (0.0 <= fVar140) {
      fVar52 = fVar140;
    }
    fVar140 = *(float *)&(This->intersector1).intersect;
    uVar39 = -(uint)(1e-18 <= ABS(CVar19.collide._0_4_));
    uVar41 = -(uint)(1e-18 <= ABS(CVar19.collide._4_4_));
    uVar45 = -(uint)(1e-18 <= ABS(CVar19.name._0_4_));
    auVar89 = divps(_DAT_01f46a60,(undefined1  [16])CVar19);
    fVar133 = (float)(~uVar39 & 0x5d5e0b6b | auVar89._0_4_ & uVar39);
    fVar136 = (float)(~uVar41 & 0x5d5e0b6b | auVar89._4_4_ & uVar41);
    fVar138 = (float)(~uVar45 & 0x5d5e0b6b | auVar89._8_4_ & uVar45);
    fVar141 = fVar133 * 0.99999964;
    fVar143 = fVar136 * 0.99999964;
    fVar145 = fVar138 * 0.99999964;
    fVar133 = fVar133 * 1.0000004;
    fVar136 = fVar136 * 1.0000004;
    fVar138 = fVar138 * 1.0000004;
    fVar60 = 0.0;
    if (0.0 <= fVar140) {
      fVar60 = fVar140;
    }
    local_f88._4_4_ = fVar133;
    local_f88._0_4_ = fVar133;
    fStack_f80 = fVar133;
    fStack_f7c = fVar133;
    local_f98._4_4_ = fVar136;
    local_f98._0_4_ = fVar136;
    fStack_f90 = fVar136;
    fStack_f8c = fVar136;
    uVar34 = (ulong)(fVar141 < 0.0) << 4;
    uVar38 = (ulong)(fVar143 < 0.0) << 4 | 0x20;
    uVar36 = (ulong)(fVar145 < 0.0) << 4 | 0x40;
    uVar37 = uVar34 ^ 0x10;
    auVar89._4_4_ = fVar60;
    auVar89._0_4_ = fVar60;
    auVar89._8_4_ = fVar60;
    auVar89._12_4_ = fVar60;
    _local_1058 = mm_lookupmask_ps._240_8_;
    _uStack_1050 = mm_lookupmask_ps._248_8_;
    local_11d0 = ray;
    local_11d8 = This;
    local_fe8 = fVar147;
    fStack_fe4 = fVar147;
    fStack_fe0 = fVar147;
    fStack_fdc = fVar147;
    local_ff8 = fVar52;
    fStack_ff4 = fVar52;
    fStack_ff0 = fVar52;
    fStack_fec = fVar52;
    local_1008 = fVar138;
    fStack_1004 = fVar138;
    fStack_1000 = fVar138;
    fStack_ffc = fVar138;
    local_1018 = fVar145;
    fStack_1014 = fVar145;
    fStack_1010 = fVar145;
    fStack_100c = fVar145;
    local_1028 = fVar85;
    fStack_1024 = fVar85;
    fStack_1020 = fVar85;
    fStack_101c = fVar85;
    local_1038 = fVar157;
    fStack_1034 = fVar157;
    fStack_1030 = fVar157;
    fStack_102c = fVar157;
    local_1118 = fVar141;
    fStack_1114 = fVar141;
    fStack_1110 = fVar141;
    fStack_110c = fVar141;
    local_1048 = fVar143;
    fStack_1044 = fVar143;
    fStack_1040 = fVar143;
    fStack_103c = fVar143;
    fVar60 = fVar147;
    fVar133 = fVar147;
    fVar136 = fVar147;
    fVar68 = fVar52;
    fVar75 = fVar52;
    fVar76 = fVar52;
    fVar77 = fVar145;
    fVar86 = fVar145;
    fVar87 = fVar145;
    fVar88 = fVar85;
    fVar96 = fVar85;
    fVar97 = fVar85;
    fVar98 = fVar157;
    fVar99 = fVar157;
    fVar100 = fVar157;
    fVar101 = fVar143;
    fVar102 = fVar143;
    fVar107 = fVar143;
    fVar113 = fVar141;
    fVar114 = fVar141;
    fVar116 = fVar141;
    fVar117 = fVar138;
    fVar118 = fVar138;
    fVar119 = fVar138;
    local_1240 = uVar34;
LAB_00575f5f:
    if (pauVar35 != (undefined1 (*) [16])&local_f78) {
      pauVar29 = pauVar35 + -1;
      pauVar35 = pauVar35 + -1;
      if (*(float *)((long)*pauVar29 + 8) <= fVar140) {
        pauVar29 = (undefined1 (*) [16])&local_f78;
        uVar32 = *(ulong *)*pauVar35;
        while ((uVar32 & 8) == 0) {
          fVar120 = *(float *)((long)&(This->collider).name + 4);
          fVar140 = *(float *)&(This->intersector1).intersect;
          uVar28 = uVar32 & 0xfffffffffffffff0;
          pfVar8 = (float *)(uVar28 + 0x80 + uVar34);
          pfVar1 = (float *)(uVar28 + 0x20 + uVar34);
          auVar90._0_4_ = ((*pfVar8 * fVar120 + *pfVar1) - fVar85) * fVar141;
          auVar90._4_4_ = ((pfVar8[1] * fVar120 + pfVar1[1]) - fVar88) * fVar113;
          auVar90._8_4_ = ((pfVar8[2] * fVar120 + pfVar1[2]) - fVar96) * fVar114;
          auVar90._12_4_ = ((pfVar8[3] * fVar120 + pfVar1[3]) - fVar97) * fVar116;
          auVar78._4_4_ = fVar68;
          auVar78._0_4_ = fVar52;
          auVar78._8_4_ = fVar75;
          auVar78._12_4_ = fVar76;
          auVar78 = maxps(auVar78,auVar90);
          pfVar8 = (float *)(uVar28 + 0x80 + uVar38);
          pfVar1 = (float *)(uVar28 + 0x20 + uVar38);
          auVar94._0_4_ = ((*pfVar8 * fVar120 + *pfVar1) - fVar157) * fVar143;
          auVar94._4_4_ = ((pfVar8[1] * fVar120 + pfVar1[1]) - fVar98) * fVar101;
          auVar94._8_4_ = ((pfVar8[2] * fVar120 + pfVar1[2]) - fVar99) * fVar102;
          auVar94._12_4_ = ((pfVar8[3] * fVar120 + pfVar1[3]) - fVar100) * fVar107;
          pfVar8 = (float *)(uVar28 + 0x80 + uVar36);
          pfVar1 = (float *)(uVar28 + 0x20 + uVar36);
          auVar105._0_4_ = ((*pfVar8 * fVar120 + *pfVar1) - fVar147) * fVar145;
          auVar105._4_4_ = ((pfVar8[1] * fVar120 + pfVar1[1]) - fVar60) * fVar77;
          auVar105._8_4_ = ((pfVar8[2] * fVar120 + pfVar1[2]) - fVar133) * fVar86;
          auVar105._12_4_ = ((pfVar8[3] * fVar120 + pfVar1[3]) - fVar136) * fVar87;
          auVar90 = maxps(auVar94,auVar105);
          _local_1108 = maxps(auVar78,auVar90);
          pfVar8 = (float *)(uVar28 + 0x80 + uVar37);
          pfVar1 = (float *)(uVar28 + 0x20 + uVar37);
          auVar110._0_4_ = ((*pfVar8 * fVar120 + *pfVar1) - fVar85) * (float)local_f88._0_4_;
          auVar110._4_4_ = ((pfVar8[1] * fVar120 + pfVar1[1]) - fVar88) * (float)local_f88._4_4_;
          auVar110._8_4_ = ((pfVar8[2] * fVar120 + pfVar1[2]) - fVar96) * fStack_f80;
          auVar110._12_4_ = ((pfVar8[3] * fVar120 + pfVar1[3]) - fVar97) * fStack_f7c;
          auVar78 = minps(auVar89,auVar110);
          pfVar8 = (float *)(uVar28 + 0x80 + (uVar38 ^ 0x10));
          pfVar1 = (float *)(uVar28 + 0x20 + (uVar38 ^ 0x10));
          auVar103._0_4_ = ((*pfVar8 * fVar120 + *pfVar1) - fVar157) * (float)local_f98._0_4_;
          auVar103._4_4_ = ((pfVar8[1] * fVar120 + pfVar1[1]) - fVar98) * (float)local_f98._4_4_;
          auVar103._8_4_ = ((pfVar8[2] * fVar120 + pfVar1[2]) - fVar99) * fStack_f90;
          auVar103._12_4_ = ((pfVar8[3] * fVar120 + pfVar1[3]) - fVar100) * fStack_f8c;
          pfVar8 = (float *)(uVar28 + 0x80 + (uVar36 ^ 0x10));
          pfVar1 = (float *)(uVar28 + 0x20 + (uVar36 ^ 0x10));
          auVar108._0_4_ = ((*pfVar8 * fVar120 + *pfVar1) - fVar147) * fVar138;
          auVar108._4_4_ = ((pfVar8[1] * fVar120 + pfVar1[1]) - fVar60) * fVar117;
          auVar108._8_4_ = ((pfVar8[2] * fVar120 + pfVar1[2]) - fVar133) * fVar118;
          auVar108._12_4_ = ((pfVar8[3] * fVar120 + pfVar1[3]) - fVar136) * fVar119;
          auVar90 = minps(auVar103,auVar108);
          auVar78 = minps(auVar78,auVar90);
          if (((uint)uVar32 & 7) == 6) {
            bVar23 = (fVar120 < *(float *)(uVar28 + 0xf0) && *(float *)(uVar28 + 0xe0) <= fVar120)
                     && local_1108._0_4_ <= auVar78._0_4_;
            bVar24 = (fVar120 < *(float *)(uVar28 + 0xf4) && *(float *)(uVar28 + 0xe4) <= fVar120)
                     && local_1108._4_4_ <= auVar78._4_4_;
            bVar25 = (fVar120 < *(float *)(uVar28 + 0xf8) && *(float *)(uVar28 + 0xe8) <= fVar120)
                     && local_1108._8_4_ <= auVar78._8_4_;
            bVar26 = (fVar120 < *(float *)(uVar28 + 0xfc) && *(float *)(uVar28 + 0xec) <= fVar120)
                     && local_1108._12_4_ <= auVar78._12_4_;
          }
          else {
            bVar23 = local_1108._0_4_ <= auVar78._0_4_;
            bVar24 = local_1108._4_4_ <= auVar78._4_4_;
            bVar25 = local_1108._8_4_ <= auVar78._8_4_;
            bVar26 = local_1108._12_4_ <= auVar78._12_4_;
          }
          auVar69._0_4_ = (uint)bVar23 * -0x80000000;
          auVar69._4_4_ = (uint)bVar24 * -0x80000000;
          auVar69._8_4_ = (uint)bVar25 * -0x80000000;
          auVar69._12_4_ = (uint)bVar26 * -0x80000000;
          uVar39 = movmskps((int)context,auVar69);
          context = (RayQueryContext *)(ulong)uVar39;
          if (uVar39 == 0) goto LAB_00575f5f;
          context = (RayQueryContext *)0x0;
          if ((byte)uVar39 != 0) {
            for (; ((byte)uVar39 >> (long)context & 1) == 0;
                context = (RayQueryContext *)((long)&context->scene + 1)) {
            }
          }
          uVar32 = *(ulong *)(uVar28 + (long)context * 8);
          uVar39 = (uVar39 & 0xff) - 1 & uVar39 & 0xff;
          pauVar29 = pauVar35;
          if (uVar39 != 0) {
            uVar41 = *(uint *)(local_1108 + (long)context * 4);
            lVar22 = 0;
            if (uVar39 != 0) {
              for (; (uVar39 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
              }
            }
            uVar21 = *(ulong *)(uVar28 + lVar22 * 8);
            uVar45 = *(uint *)(local_1108 + lVar22 * 4);
            uVar39 = uVar39 - 1 & uVar39;
            context = (RayQueryContext *)(ulong)uVar39;
            uVar34 = local_1240;
            if (uVar39 == 0) {
              pauVar29 = pauVar35 + 1;
              if (uVar41 < uVar45) {
                *(ulong *)*pauVar35 = uVar21;
                *(uint *)((long)*pauVar35 + 8) = uVar45;
                pauVar35 = pauVar29;
              }
              else {
                *(ulong *)*pauVar35 = uVar32;
                *(uint *)((long)*pauVar35 + 8) = uVar41;
                uVar32 = uVar21;
                pauVar35 = pauVar29;
              }
            }
            else {
              auVar61._8_4_ = uVar41;
              auVar61._0_8_ = uVar32;
              auVar61._12_4_ = 0;
              auVar70._8_4_ = uVar45;
              auVar70._0_8_ = uVar21;
              auVar70._12_4_ = 0;
              lVar22 = 0;
              if (context != (RayQueryContext *)0x0) {
                for (; (uVar39 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
                }
              }
              uVar32 = *(ulong *)(uVar28 + lVar22 * 8);
              iVar27 = *(int *)(local_1108 + lVar22 * 4);
              auVar79._8_4_ = iVar27;
              auVar79._0_8_ = uVar32;
              auVar79._12_4_ = 0;
              auVar91._8_4_ = -(uint)((int)uVar41 < (int)uVar45);
              uVar39 = uVar39 - 1 & uVar39;
              if (uVar39 == 0) {
                auVar91._4_4_ = auVar91._8_4_;
                auVar91._0_4_ = auVar91._8_4_;
                auVar91._12_4_ = auVar91._8_4_;
                auVar78 = auVar61 & auVar91 | ~auVar91 & auVar70;
                auVar90 = auVar70 & auVar91 | ~auVar91 & auVar61;
                auVar92._8_4_ = -(uint)(auVar78._8_4_ < iVar27);
                auVar92._0_8_ = CONCAT44(auVar92._8_4_,auVar92._8_4_);
                auVar92._12_4_ = auVar92._8_4_;
                uVar32 = ~auVar92._0_8_ & uVar32 | auVar78._0_8_ & auVar92._0_8_;
                auVar78 = auVar79 & auVar92 | ~auVar92 & auVar78;
                auVar62._8_4_ = -(uint)(auVar90._8_4_ < auVar78._8_4_);
                auVar62._4_4_ = auVar62._8_4_;
                auVar62._0_4_ = auVar62._8_4_;
                auVar62._12_4_ = auVar62._8_4_;
                *pauVar35 = ~auVar62 & auVar90 | auVar78 & auVar62;
                pauVar35[1] = auVar90 & auVar62 | ~auVar62 & auVar78;
                pauVar35 = pauVar35 + 2;
                pauVar29 = pauVar35;
              }
              else {
                context = (RayQueryContext *)0x0;
                if (uVar39 != 0) {
                  for (; (uVar39 >> (long)context & 1) == 0;
                      context = (RayQueryContext *)((long)&context->scene + 1)) {
                  }
                }
                iVar20 = *(int *)(local_1108 + (long)context * 4);
                auVar104._8_4_ = iVar20;
                auVar104._0_8_ = *(undefined8 *)(uVar28 + (long)context * 8);
                auVar104._12_4_ = 0;
                auVar93._4_4_ = auVar91._8_4_;
                auVar93._0_4_ = auVar91._8_4_;
                auVar93._8_4_ = auVar91._8_4_;
                auVar93._12_4_ = auVar91._8_4_;
                auVar78 = auVar61 & auVar93 | ~auVar93 & auVar70;
                auVar90 = auVar70 & auVar93 | ~auVar93 & auVar61;
                auVar109._0_4_ = -(uint)(iVar27 < iVar20);
                auVar109._4_4_ = -(uint)(iVar27 < iVar20);
                auVar109._8_4_ = -(uint)(iVar27 < iVar20);
                auVar109._12_4_ = -(uint)(iVar27 < iVar20);
                auVar94 = auVar79 & auVar109 | ~auVar109 & auVar104;
                auVar110 = ~auVar109 & auVar79 | auVar104 & auVar109;
                auVar80._8_4_ = -(uint)(auVar90._8_4_ < auVar110._8_4_);
                auVar80._4_4_ = auVar80._8_4_;
                auVar80._0_4_ = auVar80._8_4_;
                auVar80._12_4_ = auVar80._8_4_;
                auVar105 = auVar90 & auVar80 | ~auVar80 & auVar110;
                auVar71._8_4_ = -(uint)(auVar78._8_4_ < auVar94._8_4_);
                auVar71._0_8_ = CONCAT44(auVar71._8_4_,auVar71._8_4_);
                auVar71._12_4_ = auVar71._8_4_;
                uVar32 = auVar78._0_8_ & auVar71._0_8_ | ~auVar71._0_8_ & auVar94._0_8_;
                auVar78 = ~auVar71 & auVar78 | auVar94 & auVar71;
                auVar63._8_4_ = -(uint)(auVar78._8_4_ < auVar105._8_4_);
                auVar63._4_4_ = auVar63._8_4_;
                auVar63._0_4_ = auVar63._8_4_;
                auVar63._12_4_ = auVar63._8_4_;
                *pauVar35 = ~auVar80 & auVar90 | auVar110 & auVar80;
                pauVar35[1] = ~auVar63 & auVar78 | auVar105 & auVar63;
                pauVar35[2] = auVar78 & auVar63 | ~auVar63 & auVar105;
                pauVar35 = pauVar35 + 3;
                pauVar29 = pauVar35;
                fVar141 = local_1118;
                fVar113 = fStack_1114;
                fVar114 = fStack_1110;
                fVar116 = fStack_110c;
              }
            }
          }
        }
        pRVar33 = (RayQueryContext *)((ulong)((uint)uVar32 & 0xf) - 8);
        uVar32 = uVar32 & 0xfffffffffffffff0;
        context = (RayQueryContext *)0x0;
        while (context != pRVar33) {
          local_1238 = (long)context * 0x140;
          fVar85 = *(float *)((long)&(This->collider).name + 4);
          pfVar9 = (float *)(uVar32 + 0x90 + local_1238);
          pfVar1 = (float *)(uVar32 + local_1238);
          pfVar10 = (float *)(uVar32 + 0xa0 + local_1238);
          pfVar8 = (float *)(uVar32 + 0x10 + local_1238);
          pfVar11 = (float *)(uVar32 + 0xb0 + local_1238);
          pfVar2 = (float *)(uVar32 + 0x20 + local_1238);
          pfVar12 = (float *)(uVar32 + 0xc0 + local_1238);
          pfVar3 = (float *)(uVar32 + 0x30 + local_1238);
          pfVar13 = (float *)(uVar32 + 0xd0 + local_1238);
          pfVar4 = (float *)(uVar32 + 0x40 + local_1238);
          pfVar14 = (float *)(uVar32 + 0xe0 + local_1238);
          pfVar5 = (float *)(uVar32 + 0x50 + local_1238);
          pfVar15 = (float *)(uVar32 + 0xf0 + local_1238);
          pfVar6 = (float *)(uVar32 + 0x60 + local_1238);
          pfVar16 = (float *)(uVar32 + 0x100 + local_1238);
          pfVar7 = (float *)(uVar32 + 0x70 + local_1238);
          pfVar17 = (float *)(uVar32 + 0x110 + local_1238);
          pfVar18 = (float *)(uVar32 + 0x80 + local_1238);
          fVar157 = *(float *)&This->ptr;
          fVar147 = *(float *)((long)&This->ptr + 4);
          fVar140 = *(float *)&This->leafIntersector;
          fVar127 = (*pfVar9 * fVar85 + *pfVar1) - fVar157;
          fVar129 = (pfVar9[1] * fVar85 + pfVar1[1]) - fVar157;
          fStack_1200 = (pfVar9[2] * fVar85 + pfVar1[2]) - fVar157;
          fStack_11fc = (pfVar9[3] * fVar85 + pfVar1[3]) - fVar157;
          fVar119 = (*pfVar10 * fVar85 + *pfVar8) - fVar147;
          fVar121 = (pfVar10[1] * fVar85 + pfVar8[1]) - fVar147;
          fStack_1180 = (pfVar10[2] * fVar85 + pfVar8[2]) - fVar147;
          fStack_117c = (pfVar10[3] * fVar85 + pfVar8[3]) - fVar147;
          fVar152 = (*pfVar11 * fVar85 + *pfVar2) - fVar140;
          fVar153 = (pfVar11[1] * fVar85 + pfVar2[1]) - fVar140;
          fStack_1190 = (pfVar11[2] * fVar85 + pfVar2[2]) - fVar140;
          fStack_118c = (pfVar11[3] * fVar85 + pfVar2[3]) - fVar140;
          fVar68 = (*pfVar12 * fVar85 + *pfVar3) - fVar157;
          fVar75 = (pfVar12[1] * fVar85 + pfVar3[1]) - fVar157;
          fVar76 = (pfVar12[2] * fVar85 + pfVar3[2]) - fVar157;
          fVar77 = (pfVar12[3] * fVar85 + pfVar3[3]) - fVar157;
          fVar86 = (*pfVar13 * fVar85 + *pfVar4) - fVar147;
          fVar96 = (pfVar13[1] * fVar85 + pfVar4[1]) - fVar147;
          fVar99 = (pfVar13[2] * fVar85 + pfVar4[2]) - fVar147;
          fVar101 = (pfVar13[3] * fVar85 + pfVar4[3]) - fVar147;
          fVar114 = (*pfVar14 * fVar85 + *pfVar5) - fVar140;
          fVar116 = (pfVar14[1] * fVar85 + pfVar5[1]) - fVar140;
          fVar117 = (pfVar14[2] * fVar85 + pfVar5[2]) - fVar140;
          fVar118 = (pfVar14[3] * fVar85 + pfVar5[3]) - fVar140;
          fVar154 = (*pfVar15 * fVar85 + *pfVar6) - fVar157;
          fVar155 = (pfVar15[1] * fVar85 + pfVar6[1]) - fVar157;
          fVar156 = (pfVar15[2] * fVar85 + pfVar6[2]) - fVar157;
          fVar157 = (pfVar15[3] * fVar85 + pfVar6[3]) - fVar157;
          fVar142 = (*pfVar16 * fVar85 + *pfVar7) - fVar147;
          fVar144 = (pfVar16[1] * fVar85 + pfVar7[1]) - fVar147;
          fVar146 = (pfVar16[2] * fVar85 + pfVar7[2]) - fVar147;
          fVar147 = (pfVar16[3] * fVar85 + pfVar7[3]) - fVar147;
          fVar134 = (fVar85 * *pfVar17 + *pfVar18) - fVar140;
          fVar137 = (fVar85 * pfVar17[1] + pfVar18[1]) - fVar140;
          fVar139 = (fVar85 * pfVar17[2] + pfVar18[2]) - fVar140;
          fVar140 = (fVar85 * pfVar17[3] + pfVar18[3]) - fVar140;
          fVar87 = fVar154 - fVar127;
          fVar97 = fVar155 - fVar129;
          fStack_1210 = fVar156 - fStack_1200;
          fStack_120c = fVar157 - fStack_11fc;
          local_11b8 = fVar142 - fVar119;
          fStack_11b4 = fVar144 - fVar121;
          fStack_11b0 = fVar146 - fStack_1180;
          fStack_11ac = fVar147 - fStack_117c;
          local_11a8._0_4_ = fVar134 - fVar152;
          local_11a8._4_4_ = fVar137 - fVar153;
          fStack_11a0 = fVar139 - fStack_1190;
          fStack_119c = fVar140 - fStack_118c;
          local_1218 = (byte *)CONCAT44(fVar97,fVar87);
          fVar85 = *(float *)&(This->collider).collide;
          fStack_1230 = *(float *)((long)&(This->collider).collide + 4);
          fStack_11f0 = *(float *)&(This->collider).name;
          fVar107 = (local_11b8 * (fVar134 + fVar152) -
                    (float)local_11a8._0_4_ * (fVar142 + fVar119)) * fVar85 +
                    ((float)local_11a8._0_4_ * (fVar154 + fVar127) - (fVar134 + fVar152) * fVar87) *
                    fStack_1230 +
                    ((fVar142 + fVar119) * fVar87 - (fVar154 + fVar127) * local_11b8) * fStack_11f0;
          fVar113 = (fStack_11b4 * (fVar137 + fVar153) -
                    (float)local_11a8._4_4_ * (fVar144 + fVar121)) * fVar85 +
                    ((float)local_11a8._4_4_ * (fVar155 + fVar129) - (fVar137 + fVar153) * fVar97) *
                    fStack_1230 +
                    ((fVar144 + fVar121) * fVar97 - (fVar155 + fVar129) * fStack_11b4) * fStack_11f0
          ;
          local_fb8._0_8_ = CONCAT44(fVar113,fVar107);
          local_fb8._8_4_ =
               (fStack_11b0 * (fVar139 + fStack_1190) - fStack_11a0 * (fVar146 + fStack_1180)) *
               fVar85 + (fStack_11a0 * (fVar156 + fStack_1200) -
                        (fVar139 + fStack_1190) * fStack_1210) * fStack_1230 +
                        ((fVar146 + fStack_1180) * fStack_1210 -
                        (fVar156 + fStack_1200) * fStack_11b0) * fStack_11f0;
          local_fb8._12_4_ =
               (fStack_11ac * (fVar140 + fStack_118c) - fStack_119c * (fVar147 + fStack_117c)) *
               fVar85 + (fStack_119c * (fVar157 + fStack_11fc) -
                        (fVar140 + fStack_118c) * fStack_120c) * fStack_1230 +
                        ((fVar147 + fStack_117c) * fStack_120c -
                        (fVar157 + fStack_11fc) * fStack_11ac) * fStack_11f0;
          fVar88 = fVar119 - fVar86;
          fVar98 = fVar121 - fVar96;
          fVar100 = fStack_1180 - fVar99;
          fVar102 = fStack_117c - fVar101;
          fVar148 = fVar152 - fVar114;
          fVar149 = fVar153 - fVar116;
          fVar150 = fStack_1190 - fVar117;
          fVar151 = fStack_118c - fVar118;
          local_1188 = (RayQueryContext *)CONCAT44(fVar121,fVar119);
          local_1198 = (byte *)CONCAT44(fVar153,fVar152);
          fVar52 = fVar127 - fVar68;
          fVar60 = fVar129 - fVar75;
          fVar145 = fStack_1200 - fVar76;
          fVar143 = fStack_11fc - fVar77;
          local_1208 = (byte *)CONCAT44(fVar129,fVar127);
          local_fa8._0_4_ =
               (fVar88 * (fVar152 + fVar114) - fVar148 * (fVar119 + fVar86)) * fVar85 +
               (fVar148 * (fVar127 + fVar68) - (fVar152 + fVar114) * fVar52) * fStack_1230 +
               ((fVar119 + fVar86) * fVar52 - (fVar127 + fVar68) * fVar88) * fStack_11f0;
          local_fa8._4_4_ =
               (fVar98 * (fVar153 + fVar116) - fVar149 * (fVar121 + fVar96)) * fVar85 +
               (fVar149 * (fVar129 + fVar75) - (fVar153 + fVar116) * fVar60) * fStack_1230 +
               ((fVar121 + fVar96) * fVar60 - (fVar129 + fVar75) * fVar98) * fStack_11f0;
          local_fa8._8_4_ =
               (fVar100 * (fStack_1190 + fVar117) - fVar150 * (fStack_1180 + fVar99)) * fVar85 +
               (fVar150 * (fStack_1200 + fVar76) - (fStack_1190 + fVar117) * fVar145) * fStack_1230
               + ((fStack_1180 + fVar99) * fVar145 - (fStack_1200 + fVar76) * fVar100) * fStack_11f0
          ;
          local_fa8._12_4_ =
               (fVar102 * (fStack_118c + fVar118) - fVar151 * (fStack_117c + fVar101)) * fVar85 +
               (fVar151 * (fStack_11fc + fVar77) - (fStack_118c + fVar118) * fVar143) * fStack_1230
               + ((fStack_117c + fVar101) * fVar143 - (fStack_11fc + fVar77) * fVar102) *
                 fStack_11f0;
          fVar141 = fVar68 - fVar154;
          fVar138 = fVar75 - fVar155;
          fVar133 = fVar76 - fVar156;
          fVar136 = fVar77 - fVar157;
          fVar120 = fVar86 - fVar142;
          fVar122 = fVar96 - fVar144;
          fVar123 = fVar99 - fVar146;
          fVar125 = fVar101 - fVar147;
          fVar128 = fVar114 - fVar134;
          fVar130 = fVar116 - fVar137;
          fVar131 = fVar117 - fVar139;
          fVar132 = fVar118 - fVar140;
          local_11f8 = CONCAT44(fStack_11f0,fStack_11f0);
          fStack_11ec = fStack_11f0;
          auVar72._0_4_ =
               (fVar120 * (fVar134 + fVar114) - fVar128 * (fVar142 + fVar86)) * fVar85 +
               (fVar128 * (fVar154 + fVar68) - (fVar134 + fVar114) * fVar141) * fStack_1230 +
               ((fVar142 + fVar86) * fVar141 - (fVar154 + fVar68) * fVar120) * fStack_11f0;
          auVar72._4_4_ =
               (fVar122 * (fVar137 + fVar116) - fVar130 * (fVar144 + fVar96)) * fVar85 +
               (fVar130 * (fVar155 + fVar75) - (fVar137 + fVar116) * fVar138) * fStack_1230 +
               ((fVar144 + fVar96) * fVar138 - (fVar155 + fVar75) * fVar122) * fStack_11f0;
          auVar72._8_4_ =
               (fVar123 * (fVar139 + fVar117) - fVar131 * (fVar146 + fVar99)) * fVar85 +
               (fVar131 * (fVar156 + fVar76) - (fVar139 + fVar117) * fVar133) * fStack_1230 +
               ((fVar146 + fVar99) * fVar133 - (fVar156 + fVar76) * fVar123) * fStack_11f0;
          auVar72._12_4_ =
               (fVar125 * (fVar140 + fVar118) - fVar132 * (fVar147 + fVar101)) * fVar85 +
               (fVar132 * (fVar157 + fVar77) - (fVar140 + fVar118) * fVar136) * fStack_1230 +
               ((fVar147 + fVar101) * fVar136 - (fVar157 + fVar77) * fVar125) * fStack_11f0;
          local_fc8._0_4_ = fVar107 + local_fa8._0_4_ + auVar72._0_4_;
          local_fc8._4_4_ = fVar113 + local_fa8._4_4_ + auVar72._4_4_;
          local_fc8._8_4_ = local_fb8._8_4_ + local_fa8._8_4_ + auVar72._8_4_;
          local_fc8._12_4_ = local_fb8._12_4_ + local_fa8._12_4_ + auVar72._12_4_;
          auVar115._8_4_ = local_fb8._8_4_;
          auVar115._0_8_ = local_fb8._0_8_;
          auVar115._12_4_ = local_fb8._12_4_;
          auVar89 = minps(auVar115,local_fa8);
          auVar78 = minps(auVar89,auVar72);
          auVar89 = maxps(local_fb8,local_fa8);
          auVar89 = maxps(auVar89,auVar72);
          uVar28 = CONCAT44(local_fc8._4_4_,local_fc8._0_4_);
          local_fd8._0_8_ = uVar28 & 0x7fffffff7fffffff;
          local_fd8._8_4_ = ABS(local_fc8._8_4_);
          local_fd8._12_4_ = ABS(local_fc8._12_4_);
          auVar111._0_4_ =
               -(uint)(auVar89._0_4_ <= ABS(local_fc8._0_4_) * 1.1920929e-07 ||
                      -(ABS(local_fc8._0_4_) * 1.1920929e-07) <= auVar78._0_4_) & local_1058;
          auVar111._4_4_ =
               -(uint)(auVar89._4_4_ <= ABS(local_fc8._4_4_) * 1.1920929e-07 ||
                      -(ABS(local_fc8._4_4_) * 1.1920929e-07) <= auVar78._4_4_) & uStack_1054;
          auVar111._8_4_ =
               -(uint)(auVar89._8_4_ <= local_fd8._8_4_ * 1.1920929e-07 ||
                      -(local_fd8._8_4_ * 1.1920929e-07) <= auVar78._8_4_) & uStack_1050;
          auVar111._12_4_ =
               -(uint)(auVar89._12_4_ <= local_fd8._12_4_ * 1.1920929e-07 ||
                      -(local_fd8._12_4_ * 1.1920929e-07) <= auVar78._12_4_) & uStack_104c;
          uVar39 = movmskps((int)pauVar29,auVar111);
          pauVar29 = (undefined1 (*) [16])(ulong)uVar39;
          local_1188 = context;
          if (uVar39 != 0) {
            auVar89 = local_fd8;
            uVar41 = -(uint)(ABS(fVar148 * fVar120) <= ABS((float)local_11a8._0_4_ * fVar88));
            uVar42 = -(uint)(ABS(fVar149 * fVar122) <= ABS((float)local_11a8._4_4_ * fVar98));
            uVar46 = -(uint)(ABS(fVar150 * fVar123) <= ABS(fStack_11a0 * fVar100));
            uVar49 = -(uint)(ABS(fVar151 * fVar125) <= ABS(fStack_119c * fVar102));
            uVar45 = -(uint)(ABS(fVar52 * fVar128) <= ABS(fVar87 * fVar148));
            uVar43 = -(uint)(ABS(fVar60 * fVar130) <= ABS(fVar97 * fVar149));
            uVar47 = -(uint)(ABS(fVar145 * fVar131) <= ABS(fStack_1210 * fVar150));
            uVar50 = -(uint)(ABS(fVar143 * fVar132) <= ABS(fStack_120c * fVar151));
            uVar40 = -(uint)(ABS(fVar88 * fVar141) <= ABS(local_11b8 * fVar52));
            uVar44 = -(uint)(ABS(fVar98 * fVar138) <= ABS(fStack_11b4 * fVar60));
            uVar48 = -(uint)(ABS(fVar100 * fVar133) <= ABS(fStack_11b0 * fVar145));
            uVar51 = -(uint)(ABS(fVar102 * fVar136) <= ABS(fStack_11ac * fVar143));
            auVar95._0_4_ = (uint)(fVar88 * fVar128 - fVar148 * fVar120) & uVar41;
            auVar95._4_4_ = (uint)(fVar98 * fVar130 - fVar149 * fVar122) & uVar42;
            auVar95._8_4_ = (uint)(fVar100 * fVar131 - fVar150 * fVar123) & uVar46;
            auVar95._12_4_ = (uint)(fVar102 * fVar132 - fVar151 * fVar125) & uVar49;
            local_1088._0_4_ =
                 ~uVar41 & (uint)(local_11b8 * fVar148 - (float)local_11a8._0_4_ * fVar88);
            local_1088._4_4_ =
                 ~uVar42 & (uint)(fStack_11b4 * fVar149 - (float)local_11a8._4_4_ * fVar98);
            local_1088._8_4_ = ~uVar46 & (uint)(fStack_11b0 * fVar150 - fStack_11a0 * fVar100);
            local_1088._12_4_ = ~uVar49 & (uint)(fStack_11ac * fVar151 - fStack_119c * fVar102);
            local_1088 = local_1088 | auVar95;
            local_fd8._4_4_ = (undefined4)(local_fd8._0_8_ >> 0x20);
            local_1078[0] =
                 (float)(~uVar45 & (uint)((float)local_11a8._0_4_ * fVar52 - fVar87 * fVar148) |
                        (uint)(fVar148 * fVar141 - fVar52 * fVar128) & uVar45);
            local_1078[1] =
                 (float)(~uVar43 & (uint)((float)local_11a8._4_4_ * fVar60 - fVar97 * fVar149) |
                        (uint)(fVar149 * fVar138 - fVar60 * fVar130) & uVar43);
            local_1078[2] =
                 (float)(~uVar47 & (uint)(fStack_11a0 * fVar145 - fStack_1210 * fVar150) |
                        (uint)(fVar150 * fVar133 - fVar145 * fVar131) & uVar47);
            local_1078[3] =
                 (float)(~uVar50 & (uint)(fStack_119c * fVar143 - fStack_120c * fVar151) |
                        (uint)(fVar151 * fVar136 - fVar143 * fVar132) & uVar50);
            auVar53._0_4_ = (uint)(fVar52 * fVar120 - fVar88 * fVar141) & uVar40;
            auVar53._4_4_ = (uint)(fVar60 * fVar122 - fVar98 * fVar138) & uVar44;
            auVar53._8_4_ = (uint)(fVar145 * fVar123 - fVar100 * fVar133) & uVar48;
            auVar53._12_4_ = (uint)(fVar143 * fVar125 - fVar102 * fVar136) & uVar51;
            local_1068._0_4_ = ~uVar40 & (uint)(fVar87 * fVar88 - local_11b8 * fVar52);
            local_1068._4_4_ = ~uVar44 & (uint)(fVar97 * fVar98 - fStack_11b4 * fVar60);
            local_1068._8_4_ = ~uVar48 & (uint)(fStack_1210 * fVar100 - fStack_11b0 * fVar145);
            local_1068._12_4_ = ~uVar51 & (uint)(fStack_120c * fVar102 - fStack_11ac * fVar143);
            local_1068 = local_1068 | auVar53;
            fVar157 = fVar85 * local_1088._0_4_ +
                      fStack_1230 * local_1078[0] + fStack_11f0 * local_1068._0_4_;
            fVar147 = fVar85 * local_1088._4_4_ +
                      fStack_1230 * local_1078[1] + fStack_11f0 * local_1068._4_4_;
            fVar140 = fVar85 * local_1088._8_4_ +
                      fStack_1230 * local_1078[2] + fStack_11f0 * local_1068._8_4_;
            fVar85 = fVar85 * local_1088._12_4_ +
                     fStack_1230 * local_1078[3] + fStack_11f0 * local_1068._12_4_;
            auVar81._0_4_ = fVar157 + fVar157;
            auVar81._4_4_ = fVar147 + fVar147;
            auVar81._8_4_ = fVar140 + fVar140;
            auVar81._12_4_ = fVar85 + fVar85;
            auVar54._0_4_ = fVar119 * local_1078[0] + fVar152 * local_1068._0_4_;
            auVar54._4_4_ = fVar121 * local_1078[1] + fVar153 * local_1068._4_4_;
            auVar54._8_4_ = fStack_1180 * local_1078[2] + fStack_1190 * local_1068._8_4_;
            auVar54._12_4_ = fStack_117c * local_1078[3] + fStack_118c * local_1068._12_4_;
            fVar52 = fVar127 * local_1088._0_4_ + auVar54._0_4_;
            fVar60 = fVar129 * local_1088._4_4_ + auVar54._4_4_;
            fVar145 = fStack_1200 * local_1088._8_4_ + auVar54._8_4_;
            fVar143 = fStack_11fc * local_1088._12_4_ + auVar54._12_4_;
            auVar78 = rcpps(auVar54,auVar81);
            fVar85 = auVar78._0_4_;
            fVar157 = auVar78._4_4_;
            fVar147 = auVar78._8_4_;
            fVar140 = auVar78._12_4_;
            auVar106._0_4_ = ((1.0 - auVar81._0_4_ * fVar85) * fVar85 + fVar85) * (fVar52 + fVar52);
            auVar106._4_4_ =
                 ((1.0 - auVar81._4_4_ * fVar157) * fVar157 + fVar157) * (fVar60 + fVar60);
            auVar106._8_4_ =
                 ((1.0 - auVar81._8_4_ * fVar147) * fVar147 + fVar147) * (fVar145 + fVar145);
            auVar106._12_4_ =
                 ((1.0 - auVar81._12_4_ * fVar140) * fVar140 + fVar140) * (fVar143 + fVar143);
            fVar85 = *(float *)&(This->intersector1).intersect;
            uVar41 = *(uint *)((long)&(This->intersector1).intersect + 4);
            uVar124 = *(undefined4 *)&(This->intersector1).occluded;
            uVar126 = *(undefined4 *)((long)&(This->intersector1).occluded + 4);
            fVar157 = *(float *)((long)&This->leafIntersector + 4);
            auVar55._4_4_ = -(uint)(fVar157 <= auVar106._4_4_);
            auVar55._0_4_ = -(uint)(fVar157 <= auVar106._0_4_);
            auVar55._8_4_ = -(uint)(fVar157 <= auVar106._8_4_);
            auVar55._12_4_ = -(uint)(fVar157 <= auVar106._12_4_);
            auVar82._0_4_ =
                 (int)((uint)(auVar81._0_4_ != 0.0 &&
                             (auVar106._0_4_ <= fVar85 && fVar157 <= auVar106._0_4_)) * -0x80000000)
                 >> 0x1f;
            auVar82._4_4_ =
                 (int)((uint)(auVar81._4_4_ != 0.0 &&
                             (auVar106._4_4_ <= fVar85 && fVar157 <= auVar106._4_4_)) * -0x80000000)
                 >> 0x1f;
            auVar82._8_4_ =
                 (int)((uint)(auVar81._8_4_ != 0.0 &&
                             (auVar106._8_4_ <= fVar85 && fVar157 <= auVar106._8_4_)) * -0x80000000)
                 >> 0x1f;
            auVar82._12_4_ =
                 (int)((uint)(auVar81._12_4_ != 0.0 &&
                             (auVar106._12_4_ <= fVar85 && fVar157 <= auVar106._12_4_)) *
                      -0x80000000) >> 0x1f;
            auVar83 = auVar82 & auVar111;
            uVar39 = movmskps(uVar39,auVar83);
            pauVar29 = (undefined1 (*) [16])(ulong)uVar39;
            if (uVar39 != 0) {
              local_1108._8_4_ = local_fb8._8_4_;
              local_1108._0_8_ = local_fb8._0_8_;
              fStack_10fc = local_fb8._12_4_;
              local_10f8 = local_fa8;
              local_10e8 = local_fc8;
              local_10d8 = &local_1241;
              local_10c8 = auVar83;
              local_1098 = auVar106;
              local_11f8 = *(long *)&(ray->super_RayK<1>).org.field_0;
              local_11e8 = auVar83;
              auVar78 = rcpps(auVar55,local_fc8);
              fVar157 = auVar78._0_4_;
              fVar147 = auVar78._4_4_;
              fVar140 = auVar78._8_4_;
              fVar52 = auVar78._12_4_;
              fVar157 = (float)(-(uint)(1e-18 <= (float)local_fd8._0_4_) &
                               (uint)(((float)DAT_01f46a60 - local_fc8._0_4_ * fVar157) * fVar157 +
                                     fVar157));
              fVar147 = (float)(-(uint)(1e-18 <= (float)local_fd8._4_4_) &
                               (uint)((DAT_01f46a60._4_4_ - local_fc8._4_4_ * fVar147) * fVar147 +
                                     fVar147));
              fVar140 = (float)(-(uint)(1e-18 <= local_fd8._8_4_) &
                               (uint)((DAT_01f46a60._8_4_ - local_fc8._8_4_ * fVar140) * fVar140 +
                                     fVar140));
              fVar52 = (float)(-(uint)(1e-18 <= local_fd8._12_4_) &
                              (uint)((DAT_01f46a60._12_4_ - local_fc8._12_4_ * fVar52) * fVar52 +
                                    fVar52));
              auVar112._0_4_ = fVar107 * fVar157;
              auVar112._4_4_ = fVar113 * fVar147;
              auVar112._8_4_ = local_fb8._8_4_ * fVar140;
              auVar112._12_4_ = local_fb8._12_4_ * fVar52;
              local_10b8 = minps(auVar112,_DAT_01f46a60);
              auVar135._0_4_ = fVar157 * local_fa8._0_4_;
              auVar135._4_4_ = fVar147 * local_fa8._4_4_;
              auVar135._8_4_ = fVar140 * local_fa8._8_4_;
              auVar135._12_4_ = fVar52 * local_fa8._12_4_;
              local_10a8 = minps(auVar135,_DAT_01f46a60);
              uVar39 = auVar83._0_4_;
              uVar45 = auVar83._4_4_;
              uVar40 = auVar83._8_4_;
              uVar42 = auVar83._12_4_;
              auVar56._0_4_ = uVar39 & (uint)auVar106._0_4_;
              auVar56._4_4_ = uVar45 & (uint)auVar106._4_4_;
              auVar56._8_4_ = uVar40 & (uint)auVar106._8_4_;
              auVar56._12_4_ = uVar42 & (uint)auVar106._12_4_;
              auVar64._0_8_ = CONCAT44(~uVar45,~uVar39) & 0x7f8000007f800000;
              auVar64._8_4_ = ~uVar40 & 0x7f800000;
              auVar64._12_4_ = ~uVar42 & 0x7f800000;
              auVar64 = auVar64 | auVar56;
              auVar73._4_4_ = auVar64._0_4_;
              auVar73._0_4_ = auVar64._4_4_;
              auVar73._8_4_ = auVar64._12_4_;
              auVar73._12_4_ = auVar64._8_4_;
              auVar78 = minps(auVar73,auVar64);
              auVar57._0_8_ = auVar78._8_8_;
              auVar57._8_4_ = auVar78._0_4_;
              auVar57._12_4_ = auVar78._4_4_;
              auVar78 = minps(auVar57,auVar78);
              auVar58._0_8_ =
                   CONCAT44(-(uint)(auVar78._4_4_ == auVar64._4_4_) & uVar45,
                            -(uint)(auVar78._0_4_ == auVar64._0_4_) & uVar39);
              auVar58._8_4_ = -(uint)(auVar78._8_4_ == auVar64._8_4_) & uVar40;
              auVar58._12_4_ = -(uint)(auVar78._12_4_ == auVar64._12_4_) & uVar42;
              iVar27 = movmskps((int)local_11f8,auVar58);
              if (iVar27 != 0) {
                auVar83._8_4_ = auVar58._8_4_;
                auVar83._0_8_ = auVar58._0_8_;
                auVar83._12_4_ = auVar58._12_4_;
              }
              local_1238 = local_1238 + uVar32;
              pauVar29 = (undefined1 (*) [16])(ulong)uVar41;
              uVar30 = movmskps((int)context,auVar83);
              uVar28 = CONCAT44((int)((ulong)context >> 0x20),uVar30);
              pbVar31 = (byte *)0x0;
              fStack_122c = fStack_1230;
              local_fd8 = auVar89;
              if (uVar28 != 0) {
                for (; (uVar28 >> (long)pbVar31 & 1) == 0; pbVar31 = pbVar31 + 1) {
                }
              }
LAB_0057690c:
              local_1130 = *(uint *)(local_1238 + 0x120 + (long)pbVar31 * 4);
              local_1218 = *(byte **)(*(long *)(local_11f8 + 0x1e8) + (ulong)local_1130 * 8);
              if ((*(uint *)(local_1218 + 0x34) & (uint)pauVar29) == 0) {
                *(undefined4 *)(local_11e8 + (long)pbVar31 * 4) = 0;
              }
              else {
                local_1208 = pbVar31;
                local_1198 = *(byte **)&(ray->super_RayK<1>).dir.field_0;
                if (*(long *)(local_1198 + 0x10) == 0) {
                  local_1168 = *(undefined4 **)((long)&(ray->super_RayK<1>).org.field_0 + 8);
                  if (*(long *)(local_1218 + 0x40) == 0) {
                    uVar124 = *(undefined4 *)(local_10b8 + (long)pbVar31 * 4);
                    uVar126 = *(undefined4 *)(local_10a8 + (long)pbVar31 * 4);
                    *(undefined4 *)&(This->intersector1).intersect =
                         *(undefined4 *)(local_1098 + (long)pbVar31 * 4);
                    *(float *)&(This->intersector1).pointQuery = local_1078[(long)(pbVar31 + -4)];
                    *(float *)((long)&(This->intersector1).pointQuery + 4) =
                         local_1078[(long)pbVar31];
                    *(undefined4 *)&(This->intersector1).name =
                         *(undefined4 *)(local_1068 + (long)pbVar31 * 4);
                    *(undefined4 *)((long)&(This->intersector1).name + 4) = uVar124;
                    *(undefined4 *)&(This->intersector4).intersect = uVar126;
                    *(undefined4 *)((long)&(This->intersector4).intersect + 4) =
                         *(undefined4 *)(local_1238 + 0x130 + (long)pbVar31 * 4);
                    *(uint *)&(This->intersector4).occluded = local_1130;
                    *(undefined4 *)((long)&(This->intersector4).occluded + 4) = *local_1168;
                    pauVar29 = (undefined1 (*) [16])(ulong)(uint)local_1168[1];
                    *(undefined4 *)&(This->intersector4).name = local_1168[1];
                    goto LAB_00576caa;
                  }
                  local_11b8 = fVar85;
                  fStack_11b4 = (float)uVar41;
                  fStack_11b0 = (float)uVar124;
                  fStack_11ac = (float)uVar126;
                }
                else {
                  local_11b8 = fVar85;
                  fStack_11b4 = (float)uVar41;
                  fStack_11b0 = (float)uVar124;
                  fStack_11ac = (float)uVar126;
                  local_1168 = *(undefined4 **)((long)&(ray->super_RayK<1>).org.field_0 + 8);
                }
                local_1148 = local_1078[(long)(pbVar31 + -4)];
                local_1144 = local_1078[(long)pbVar31];
                local_1140 = *(undefined4 *)(local_1068 + (long)pbVar31 * 4);
                local_113c = *(undefined4 *)(local_10b8 + (long)pbVar31 * 4);
                local_1138 = *(undefined4 *)(local_10a8 + (long)pbVar31 * 4);
                local_1134 = *(undefined4 *)(local_1238 + 0x130 + (long)pbVar31 * 4);
                local_112c = *local_1168;
                local_1128 = local_1168[1];
                *(undefined4 *)&(This->intersector1).intersect =
                     *(undefined4 *)(local_1098 + (long)pbVar31 * 4);
                local_121c = -1;
                local_1178 = &local_121c;
                pbVar31 = *(byte **)(local_1218 + 0x18);
                local_1170 = pbVar31;
                local_1160 = This;
                local_1158 = &local_1148;
                local_1150 = 1;
                local_11c0 = pauVar35;
                local_11c8 = pRVar33;
                _local_11a8 = auVar106;
                local_11b8 = fVar85;
                fStack_11b4 = (float)uVar41;
                fStack_11b0 = (float)uVar124;
                fStack_11ac = (float)uVar126;
                if (((*(code **)(local_1218 + 0x40) == (code *)0x0) ||
                    ((**(code **)(local_1218 + 0x40))(&local_1178), ray = local_11d0,
                    This = local_11d8, uVar34 = local_1240, *local_1178 != 0)) &&
                   ((*(code **)(local_1198 + 0x10) == (code *)0x0 ||
                    (((pbVar31 = local_1198, (*local_1198 & 2) == 0 &&
                      (pbVar31 = local_1218, (local_1218[0x3e] & 0x40) == 0)) ||
                     ((**(code **)(local_1198 + 0x10))(&local_1178), ray = local_11d0,
                     This = local_11d8, uVar34 = local_1240, *local_1178 != 0)))))) {
                  *(float *)&(local_1160->intersector1).pointQuery = *local_1158;
                  *(float *)((long)&(local_1160->intersector1).pointQuery + 4) = local_1158[1];
                  *(float *)&(local_1160->intersector1).name = local_1158[2];
                  *(float *)((long)&(local_1160->intersector1).name + 4) = local_1158[3];
                  *(float *)&(local_1160->intersector4).intersect = local_1158[4];
                  *(float *)((long)&(local_1160->intersector4).intersect + 4) = local_1158[5];
                  *(float *)&(local_1160->intersector4).occluded = local_1158[6];
                  *(float *)((long)&(local_1160->intersector4).occluded + 4) = local_1158[7];
                  pbVar31 = (byte *)(ulong)(uint)local_1158[8];
                  *(float *)&(local_1160->intersector4).name = local_1158[8];
                  pRVar33 = local_11c8;
                  pauVar35 = local_11c0;
                }
                else {
                  *(float *)&(local_11d8->intersector1).intersect = local_11b8;
                  ray = local_11d0;
                  This = local_11d8;
                  pRVar33 = local_11c8;
                  uVar34 = local_1240;
                  pauVar35 = local_11c0;
                }
                *(undefined4 *)(local_11e8 + (long)local_1208 * 4) = 0;
                fVar85 = *(float *)&(This->intersector1).intersect;
                uVar41 = *(uint *)((long)&(This->intersector1).intersect + 4);
                uVar124 = *(undefined4 *)&(This->intersector1).occluded;
                uVar126 = *(undefined4 *)((long)&(This->intersector1).occluded + 4);
                local_11e8._0_4_ = -(uint)(local_11a8._0_4_ <= fVar85) & local_11e8._0_4_;
                local_11e8._4_4_ = -(uint)(local_11a8._4_4_ <= fVar85) & local_11e8._4_4_;
                local_11e8._8_4_ = -(uint)(local_11a8._8_4_ <= fVar85) & local_11e8._8_4_;
                local_11e8._12_4_ = -(uint)(local_11a8._12_4_ <= fVar85) & local_11e8._12_4_;
                pauVar29 = (undefined1 (*) [16])
                           (ulong)*(uint *)((long)&(This->intersector1).intersect + 4);
                auVar106 = _local_11a8;
              }
              iVar27 = movmskps((int)pbVar31,local_11e8);
              if (iVar27 == 0) goto LAB_00576caa;
              uVar39 = local_11e8._0_4_;
              uVar45 = local_11e8._4_4_;
              uVar40 = local_11e8._8_4_;
              uVar42 = local_11e8._12_4_;
              auVar65._0_4_ = uVar39 & auVar106._0_4_;
              auVar65._4_4_ = uVar45 & auVar106._4_4_;
              auVar65._8_4_ = uVar40 & auVar106._8_4_;
              auVar65._12_4_ = uVar42 & auVar106._12_4_;
              auVar74._0_8_ = CONCAT44(~uVar45,~uVar39) & 0x7f8000007f800000;
              auVar74._8_4_ = ~uVar40 & 0x7f800000;
              auVar74._12_4_ = ~uVar42 & 0x7f800000;
              auVar74 = auVar74 | auVar65;
              auVar84._4_4_ = auVar74._0_4_;
              auVar84._0_4_ = auVar74._4_4_;
              auVar84._8_4_ = auVar74._12_4_;
              auVar84._12_4_ = auVar74._8_4_;
              auVar89 = minps(auVar84,auVar74);
              auVar66._0_8_ = auVar89._8_8_;
              auVar66._8_4_ = auVar89._0_4_;
              auVar66._12_4_ = auVar89._4_4_;
              auVar89 = minps(auVar66,auVar89);
              auVar67._0_8_ =
                   CONCAT44(-(uint)(auVar89._4_4_ == auVar74._4_4_) & uVar45,
                            -(uint)(auVar89._0_4_ == auVar74._0_4_) & uVar39);
              auVar67._8_4_ = -(uint)(auVar89._8_4_ == auVar74._8_4_) & uVar40;
              auVar67._12_4_ = -(uint)(auVar89._12_4_ == auVar74._12_4_) & uVar42;
              iVar27 = movmskps(iVar27,auVar67);
              auVar59 = local_11e8;
              if (iVar27 != 0) {
                auVar59._8_4_ = auVar67._8_4_;
                auVar59._0_8_ = auVar67._0_8_;
                auVar59._12_4_ = auVar67._12_4_;
              }
              uVar30 = movmskps(iVar27,auVar59);
              uVar28 = CONCAT44((int)((ulong)pbVar31 >> 0x20),uVar30);
              pbVar31 = (byte *)0x0;
              if (uVar28 != 0) {
                for (; (uVar28 >> (long)pbVar31 & 1) == 0; pbVar31 = pbVar31 + 1) {
                }
              }
              goto LAB_0057690c;
            }
          }
LAB_00576caa:
          fVar147 = local_fe8;
          fVar60 = fStack_fe4;
          fVar133 = fStack_fe0;
          fVar136 = fStack_fdc;
          fVar52 = local_ff8;
          fVar68 = fStack_ff4;
          fVar75 = fStack_ff0;
          fVar76 = fStack_fec;
          fVar145 = local_1018;
          fVar77 = fStack_1014;
          fVar86 = fStack_1010;
          fVar87 = fStack_100c;
          fVar85 = local_1028;
          fVar88 = fStack_1024;
          fVar96 = fStack_1020;
          fVar97 = fStack_101c;
          fVar157 = local_1038;
          fVar98 = fStack_1034;
          fVar99 = fStack_1030;
          fVar100 = fStack_102c;
          fVar143 = local_1048;
          fVar101 = fStack_1044;
          fVar102 = fStack_1040;
          fVar107 = fStack_103c;
          fVar141 = local_1118;
          fVar113 = fStack_1114;
          fVar114 = fStack_1110;
          fVar116 = fStack_110c;
          fVar138 = local_1008;
          fVar117 = fStack_1004;
          fVar118 = fStack_1000;
          fVar119 = fStack_ffc;
          context = (RayQueryContext *)((long)&local_1188->scene + 1);
        }
        fVar140 = *(float *)&(This->intersector1).intersect;
        auVar89._4_4_ = fVar140;
        auVar89._0_4_ = fVar140;
        auVar89._8_4_ = fVar140;
        auVar89._12_4_ = fVar140;
      }
      goto LAB_00575f5f;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }